

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

void __thiscall
ON_Annotation::SetSuppressArrow2(ON_Annotation *this,ON_DimStyle *parent_style,bool value)

{
  bool bVar1;
  ON_DimStyle *pOVar2;
  
  pOVar2 = ON_DimStyle::DimStyleOrDefault(parent_style);
  bVar1 = ON_DimStyle::SuppressArrow2(pOVar2);
  pOVar2 = Internal_GetOverrideStyle(this,bVar1 != value);
  if (pOVar2 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetSuppressArrow2(pOVar2,value);
    ON_DimStyle::SetFieldOverride(pOVar2,SuppressArrow2,bVar1 != value);
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetSuppressArrow2(const ON_DimStyle* parent_style, bool value)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = (value != parent_style->SuppressArrow2());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetSuppressArrow2(value);
    override_style->SetFieldOverride(ON_DimStyle::field::SuppressArrow2, bCreate);
  }
}